

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLVector3.cpp
# Opt level: O3

Vector3 * AML::cross(Vector3 *lhs,Vector3 *rhs)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  Vector3 *in_RDI;
  
  dVar1 = (rhs->field_0).data[0];
  dVar2 = (lhs->field_0).data[0];
  dVar3 = (lhs->field_0).data[1];
  dVar4 = (lhs->field_0).data[2];
  dVar5 = (rhs->field_0).data[1];
  dVar6 = (rhs->field_0).data[2];
  (in_RDI->field_0).data[0] = dVar6 * dVar3 - dVar4 * dVar5;
  (in_RDI->field_0).data[1] = dVar1 * dVar4 - dVar2 * dVar6;
  (in_RDI->field_0).data[2] = dVar2 * dVar5 - dVar1 * dVar3;
  return in_RDI;
}

Assistant:

Vector3 cross(const Vector3& lhs, const Vector3& rhs)
    {
        double x = (lhs.y * rhs.z) - (lhs.z * rhs.y);
        double y = (lhs.z * rhs.x) - (lhs.x * rhs.z);
        double z = (lhs.x * rhs.y) - (lhs.y * rhs.x);
        return Vector3(x, y, z);
    }